

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,int>>::emplace<QString_const&,int&>
          (QMovableArrayOps<std::pair<QString,int>> *this,qsizetype i,QString *args,int *args_1)

{
  long *plVar1;
  int iVar2;
  int *piVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  piVar3 = *(int **)this;
  if ((piVar3 != (int *)0x0) && (*piVar3 < 2)) {
    lVar8 = *(long *)(this + 0x10);
    if ((lVar8 == i && piVar3 != (int *)0x0) &&
       (*(long *)(piVar3 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 5) + lVar8)) {
      lVar6 = *(long *)(this + 8);
      lVar8 = lVar8 * 0x20;
      pDVar4 = (args->d).d;
      *(Data **)(lVar6 + lVar8) = pDVar4;
      *(char16_t **)(lVar6 + 8 + lVar8) = (args->d).ptr;
      *(qsizetype *)(lVar6 + 0x10 + lVar8) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(int *)(lVar6 + lVar8 + 0x18) = *args_1;
      goto LAB_004a0fe1;
    }
    if (((i == 0) && (piVar3 != (int *)0x0)) &&
       (((long)piVar3 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      lVar8 = *(long *)(this + 8);
      pDVar4 = (args->d).d;
      *(Data **)(lVar8 + -0x20) = pDVar4;
      *(char16_t **)(lVar8 + -0x18) = (args->d).ptr;
      *(qsizetype *)(lVar8 + -0x10) = (args->d).size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(int *)(lVar8 + -8) = *args_1;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
      goto LAB_004a0fe1;
    }
  }
  pDVar4 = (args->d).d;
  pcVar5 = (args->d).ptr;
  lVar8 = (args->d).size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  iVar2 = *args_1;
  lVar6 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QString,_int>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QString,_int>_> *)this,(uint)(i == 0 && lVar6 != 0),1,
             (pair<QString,_int> **)0x0,(QArrayDataPointer<std::pair<QString,_int>_> *)0x0);
  lVar7 = *(long *)(this + 8);
  if (i == 0 && lVar6 != 0) {
    *(Data **)(lVar7 + -0x20) = pDVar4;
    *(char16_t **)(lVar7 + -0x18) = pcVar5;
    *(long *)(lVar7 + -0x10) = lVar8;
    *(int *)(lVar7 + -8) = iVar2;
    *(long *)(this + 8) = lVar7 + -0x20;
  }
  else {
    plVar1 = (long *)(lVar7 + i * 0x20);
    memmove(plVar1 + 4,(void *)(lVar7 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
    *plVar1 = (long)pDVar4;
    plVar1[1] = (long)pcVar5;
    plVar1[2] = lVar8;
    *(int *)(plVar1 + 3) = iVar2;
  }
LAB_004a0fe1:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }